

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  String *pSVar1;
  int iVar2;
  uint in_ECX;
  String *this_00;
  Array<const_char_*> argv;
  char *local_50;
  Array<const_char_*> local_48;
  
  local_48._capacity = ___oflag[2];
  local_48._begin.item = (char **)0x0;
  local_48._end.item = (char **)0x0;
  pSVar1 = (String *)*___oflag;
  for (this_00 = (String *)___oflag[1]; this_00 != pSVar1; this_00 = (String *)this_00[1]._data.str)
  {
    local_50 = String::operator_cast_to_char_(this_00);
    Array<const_char_*>::append(&local_48,&local_50);
  }
  iVar2 = open(this,__file,(int)___oflag[2],local_48._begin.item,(ulong)in_ECX);
  Array<const_char_*>::~Array(&local_48);
  return iVar2;
}

Assistant:

bool Process::open(const String& executable, const List<String>& args, uint streams)
{
  Array<const char*> argv(args.size());
  for (List<String>::Iterator i = args.begin(), end = args.end(); i != end; ++i)
    argv.append((const char*)*i);
  return open(executable, (int)args.size(), (char**)(const char**)argv, streams);
}